

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeCount(sqlite3 *db,BtCursor *pCur,i64 *pnEntry)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  MemPage *pMVar4;
  int unaff_EBP;
  uint uVar5;
  i64 iVar6;
  
  iVar3 = moveToRoot(pCur);
  if (iVar3 == 0x10) {
    *pnEntry = 0;
    unaff_EBP = 0;
  }
  else {
    iVar6 = 0;
    do {
      if (iVar3 != 0) {
        return iVar3;
      }
      if ((db->u1).isInterrupted != 0) {
        return 0;
      }
      pMVar4 = pCur->pPage;
      if ((pMVar4->leaf != '\0') || (pMVar4->intKey == '\0')) {
        iVar6 = iVar6 + (ulong)pMVar4->nCell;
      }
      if (pMVar4->leaf != '\0') {
        do {
          if (pCur->iPage == '\0') {
            *pnEntry = iVar6;
            unaff_EBP = moveToRoot(pCur);
            iVar3 = 0;
            bVar2 = false;
            goto LAB_0014bc75;
          }
          moveToParent(pCur);
          pMVar4 = pCur->pPage;
        } while (pMVar4->nCell <= pCur->ix);
        pCur->ix = pCur->ix + 1;
      }
      uVar1 = pCur->ix;
      if (uVar1 == pMVar4->nCell) {
        uVar5 = *(uint *)(pMVar4->aData + (ulong)pMVar4->hdrOffset + 8);
      }
      else {
        uVar5 = *(uint *)(pMVar4->aData +
                         (CONCAT11(pMVar4->aCellIdx[(ulong)uVar1 * 2],
                                   pMVar4->aCellIdx[(ulong)uVar1 * 2 + 1]) & pMVar4->maskPage));
      }
      iVar3 = moveToChild(pCur,uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                               uVar5 << 0x18);
      bVar2 = true;
LAB_0014bc75:
    } while (bVar2);
  }
  return unaff_EBP;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCount(sqlite3 *db, BtCursor *pCur, i64 *pnEntry){
  i64 nEntry = 0;                      /* Value to return in *pnEntry */
  int rc;                              /* Return code */

  rc = moveToRoot(pCur);
  if( rc==SQLITE_EMPTY ){
    *pnEntry = 0;
    return SQLITE_OK;
  }

  /* Unless an error occurs, the following loop runs one iteration for each
  ** page in the B-Tree structure (not including overflow pages).
  */
  while( rc==SQLITE_OK && !AtomicLoad(&db->u1.isInterrupted) ){
    int iIdx;                          /* Index of child node in parent */
    MemPage *pPage;                    /* Current page of the b-tree */

    /* If this is a leaf page or the tree is not an int-key tree, then
    ** this page contains countable entries. Increment the entry counter
    ** accordingly.
    */
    pPage = pCur->pPage;
    if( pPage->leaf || !pPage->intKey ){
      nEntry += pPage->nCell;
    }

    /* pPage is a leaf node. This loop navigates the cursor so that it
    ** points to the first interior cell that it points to the parent of
    ** the next page in the tree that has not yet been visited. The
    ** pCur->aiIdx[pCur->iPage] value is set to the index of the parent cell
    ** of the page, or to the number of cells in the page if the next page
    ** to visit is the right-child of its parent.
    **
    ** If all pages in the tree have been visited, return SQLITE_OK to the
    ** caller.
    */
    if( pPage->leaf ){
      do {
        if( pCur->iPage==0 ){
          /* All pages of the b-tree have been visited. Return successfully. */
          *pnEntry = nEntry;
          return moveToRoot(pCur);
        }
        moveToParent(pCur);
      }while ( pCur->ix>=pCur->pPage->nCell );

      pCur->ix++;
      pPage = pCur->pPage;
    }

    /* Descend to the child node of the cell that the cursor currently
    ** points at. This is the right-child if (iIdx==pPage->nCell).
    */
    iIdx = pCur->ix;
    if( iIdx==pPage->nCell ){
      rc = moveToChild(pCur, get4byte(&pPage->aData[pPage->hdrOffset+8]));
    }else{
      rc = moveToChild(pCur, get4byte(findCell(pPage, iIdx)));
    }
  }

  /* An error has occurred. Return an error code. */
  return rc;
}